

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::FileEntry::FileEntry(FileEntry *this,uint64_t ofs,uint8_t *pdata)

{
  uint uVar1;
  uint32_t uVar2;
  string *__return_storage_ptr__;
  
  (this->super_DirEntry)._ofs = ofs;
  (this->super_DirEntry)._magic = 0;
  (this->super_DirEntry)._indexptr = 0;
  (this->super_DirEntry)._indexsize = 0;
  (this->super_DirEntry)._size = 0;
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__FileEntry_001462e8;
  nameinfo::nameinfo(&this->_name,pdata + 0xc);
  uVar1 = *(uint *)pdata;
  (this->super_DirEntry)._magic = uVar1;
  if ((uVar1 & 0xfffff7ff) != 0xfffff6fe) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    uVar2 = DirEntry::offset(&this->super_DirEntry);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"FileEntry@%08x: invalid magic: %08x",(ulong)uVar2,
               (ulong)(this->super_DirEntry)._magic);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  uVar2 = *(uint32_t *)(pdata + 4);
  this->_datatable = uVar2;
  this->_sectionlist = *(uint32_t *)(pdata + 8);
  (this->super_DirEntry)._size = *(uint32_t *)(pdata + 0x18);
  this->_attr = *(uint32_t *)(pdata + 0x1c);
  this->_filetime = *(uint64_t *)(pdata + 0x20);
  this->_reserved = *(uint32_t *)(pdata + 0x28);
  (this->super_DirEntry)._indexptr = *(uint32_t *)(pdata + 0x2c);
  (this->super_DirEntry)._indexsize = *(uint32_t *)(pdata + 0x30);
  if (uVar2 != 0) {
    printf("warning: file datatable= %08x\n");
    return;
  }
  return;
}

Assistant:

FileEntry(uint64_t ofs, const uint8_t *pdata)
            : DirEntry(ofs), _name(pdata+12)
        {
            _magic= get32le(pdata);
            if ((_magic&~0x800)!=MAGIC)
                throw stringformat("FileEntry@%08x: invalid magic: %08x", offset(), _magic);

            _datatable= get32le(pdata+4);
            _sectionlist= get32le(pdata+8);
            //name : pdata+12
            _size= get32le(pdata+24);
            _attr= get32le(pdata+28);
            _filetime= get64le(pdata+32);
            _reserved= get32le(pdata+40);
            _indexptr= get32le(pdata+44);
            _indexsize= get32le(pdata+48);

            if (_datatable)
                printf("warning: file datatable= %08x\n", _datatable);
        }